

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void libcmepoll_LTX_write_select
               (CMtrans_services_conflict svc,select_data_ptr *sdp,int fd,select_list_func func,
               void *arg1,void *arg2)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  uint *puVar4;
  long in_RCX;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int size;
  int i;
  epoll_event ep_event;
  select_data_ptr sd;
  CManager in_stack_ffffffffffffff90;
  FILE *pFVar5;
  select_data_ptr *in_stack_ffffffffffffff98;
  CMtrans_services_conflict in_stack_ffffffffffffffa0;
  int local_48;
  undefined1 local_44 [20];
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  int local_14;
  long *local_10;
  long local_8;
  
  local_44._12_8_ = *in_RSI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  if (local_44._12_8_ == 0) {
    local_10 = in_RSI;
    init_select_data(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    local_44._12_8_ = *local_10;
  }
  if ((*(long *)(local_44._12_8_ + 0x30) != 0) &&
     (iVar1 = (**(code **)(local_8 + 0xb8))
                        (*(undefined8 *)(local_44._12_8_ + 0x30),
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                         ,0x217), iVar1 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
           ,0x217,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  memset(local_44,0,0xc);
  *(int *)(local_44._12_8_ + 0x38) = *(int *)(local_44._12_8_ + 0x38) + 1;
  if (*(int *)(local_44._12_8_ + 0xc) < local_14) {
    iVar1 = (local_14 + 1) * 0x18;
    uVar2 = (**(code **)(local_8 + 8))(*(undefined8 *)(local_44._12_8_ + 0x10),(long)iVar1);
    *(undefined8 *)(local_44._12_8_ + 0x10) = uVar2;
    uVar2 = (**(code **)(local_8 + 8))(*(undefined8 *)(local_44._12_8_ + 0x18),(long)iVar1);
    *(undefined8 *)(local_44._12_8_ + 0x18) = uVar2;
    if ((*(long *)(local_44._12_8_ + 0x10) == 0) || (*(long *)(local_44._12_8_ + 0x18) == 0)) {
      perror("Realloc failed\n");
      exit(1);
    }
    local_48 = *(int *)(local_44._12_8_ + 0xc);
    while (local_48 = local_48 + 1, local_48 <= local_14) {
      *(undefined8 *)(*(long *)(local_44._12_8_ + 0x18) + (long)local_48 * 0x18) = 0;
      *(undefined8 *)(*(long *)(local_44._12_8_ + 0x18) + (long)local_48 * 0x18 + 8) = 0;
      *(undefined8 *)(*(long *)(local_44._12_8_ + 0x18) + (long)local_48 * 0x18 + 0x10) = 0;
      *(undefined8 *)(*(long *)(local_44._12_8_ + 0x10) + (long)local_48 * 0x18) = 0;
      *(undefined8 *)(*(long *)(local_44._12_8_ + 0x10) + (long)local_48 * 0x18 + 8) = 0;
      *(undefined8 *)(*(long *)(local_44._12_8_ + 0x10) + (long)local_48 * 0x18 + 0x10) = 0;
    }
    *(int *)(local_44._12_8_ + 0xc) = local_14;
  }
  local_44._4_4_ = local_14;
  if (local_20 == 0) {
    if (*(long *)(*(long *)(local_44._12_8_ + 0x10) + (long)local_14 * 0x18) == 0) {
      iVar1 = epoll_ctl(*(int *)(local_44._12_8_ + 8),2,local_14,(epoll_event *)local_44);
      if (iVar1 < 0) {
        pFVar5 = _stderr;
        puVar4 = (uint *)__errno_location();
        fprintf(pFVar5,"Something bad happened in %s. %d\n","libcmepoll_LTX_write_select",
                (ulong)*puVar4);
      }
    }
    else {
      local_44._0_4_ = 1;
      iVar1 = epoll_ctl(*(int *)(local_44._12_8_ + 8),3,local_14,(epoll_event *)local_44);
      if (iVar1 < 0) {
        pFVar5 = _stderr;
        puVar4 = (uint *)__errno_location();
        fprintf(pFVar5,"Something bad in %s. %d\n","libcmepoll_LTX_write_select",(ulong)*puVar4);
      }
    }
  }
  else {
    local_44._0_4_ = 4;
    iVar1 = epoll_ctl(*(int *)(local_44._12_8_ + 8),1,local_14,(epoll_event *)local_44);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0x11) {
        local_44._0_4_ = 5;
        iVar1 = epoll_ctl(*(int *)(local_44._12_8_ + 8),3,local_14,(epoll_event *)local_44);
        pFVar5 = _stderr;
        if (iVar1 < 0) {
          puVar4 = (uint *)__errno_location();
          fprintf(pFVar5,"Something bad in %s. %d\n","libcmepoll_LTX_write_select",(ulong)*puVar4);
        }
      }
      else {
        pFVar5 = _stderr;
        puVar4 = (uint *)__errno_location();
        fprintf(pFVar5,"Something bad in %s. %d\n","libcmepoll_LTX_write_select",(ulong)*puVar4);
      }
    }
  }
  *(long *)(*(long *)(local_44._12_8_ + 0x18) + (long)local_14 * 0x18) = local_20;
  *(undefined8 *)(*(long *)(local_44._12_8_ + 0x18) + (long)local_14 * 0x18 + 8) = local_28;
  *(undefined8 *)(*(long *)(local_44._12_8_ + 0x18) + (long)local_14 * 0x18 + 0x10) = local_30;
  wake_server_thread((select_data_ptr)0x101bda);
  return;
}

Assistant:

extern void
libcmepoll_LTX_write_select(CMtrans_services svc, select_data_ptr *sdp, int fd, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    struct epoll_event ep_event;

    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    memset(&ep_event, 0, sizeof(ep_event));
    sd->select_consistency_number++;
    if (fd > sd->sel_item_max) {
	int i;
	int size = (fd+1)*sizeof(sd->select_items[0]);
	sd->select_items = 
	    (FunctionListElement *) svc->realloc_func(sd->select_items, size);
	sd->write_items = 
	    (FunctionListElement *) svc->realloc_func(sd->write_items, size);
	if ((sd->select_items == NULL) || (sd->write_items == NULL)) {
	    perror("Realloc failed\n");
	    exit(1);
	}

	for (i = sd->sel_item_max + 1; i <= fd; i++) {
	    sd->write_items[i].func = NULL;
	    sd->write_items[i].arg1 = NULL;
	    sd->write_items[i].arg2 = NULL;
	    sd->select_items[i].func = NULL;
	    sd->select_items[i].arg1 = NULL;
	    sd->select_items[i].arg2 = NULL;
	}
	sd->sel_item_max = fd;
    }
    ep_event.data.fd = fd;
    if(func != NULL) {
    	ep_event.events = EPOLLOUT;
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_ADD, fd, &ep_event) < 0) {
    		if(errno == EEXIST) {
    		    /* This is fd is already armed for read */
    		    ep_event.events = EPOLLIN | EPOLLOUT;
    		    if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    		    	fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		    }
    		} else {
    		    fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		}
    	}
    } else if(sd->select_items[fd].func) {
    	/* This fd should stay armed for read */
    	ep_event.events = EPOLLIN;
    	if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    	}
	} else {
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_DEL, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
    	}
    }

    sd->write_items[fd].func = func;
    sd->write_items[fd].arg1 = arg1;
    sd->write_items[fd].arg2 = arg2;
    wake_server_thread(sd);
}